

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O1

int __thiscall ot::commissioner::MockSocket::Receive(MockSocket *this,ByteArray *aBuf)

{
  int iVar1;
  int iVar2;
  uint8_t buf [512];
  undefined1 auStack_218 [512];
  
  iVar1 = (*(this->super_Socket)._vptr_Socket[7])(this,auStack_218,0x200);
  while (0 < iVar1) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf,
               (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,auStack_218);
    iVar1 = (*(this->super_Socket)._vptr_Socket[7])(this,auStack_218,0x200);
  }
  iVar2 = 0;
  if ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar2 = -0x6900;
  }
  if (iVar1 != -0x6900) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int MockSocket::Receive(ByteArray &aBuf)
{
    uint8_t buf[512];
    int     rval;

    while ((rval = Receive(buf, sizeof(buf))) > 0)
    {
        aBuf.insert(aBuf.end(), buf, buf + rval);
    }

    VerifyOrExit(rval != MBEDTLS_ERR_SSL_WANT_READ || aBuf.empty(), rval = 0);

exit:
    return rval;
}